

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::BasicSolver::InitMetaInfoAndOptions
          (BasicSolver *this,CStringRef name,CStringRef long_name,long date,int flags)

{
  ValueArrayRef values;
  ValueArrayRef values_00;
  ValueArrayRef values_01;
  ValueArrayRef values_02;
  char *pcVar1;
  char *name_00;
  void *get;
  OptionPtr *opt;
  char *name_01;
  OptionValueInfo *pOVar2;
  BoolOption *this_00;
  undefined8 in_RCX;
  char *description;
  SolverOptionManager *this_01;
  long in_RDI;
  uint in_R8D;
  pointer in_stack_fffffffffffffde8;
  code *pcVar3;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *in_stack_fffffffffffffdf0;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *puVar4;
  BasicSolver *in_stack_fffffffffffffdf8;
  VersionOption *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  bool *in_stack_fffffffffffffe18;
  BoolOption *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  SolverOptionManager *in_stack_fffffffffffffe40;
  OptionValueInfo *in_stack_fffffffffffffe48;
  undefined1 *puVar5;
  OptionPtr *in_stack_fffffffffffffe78;
  SolverOptionManager *in_stack_fffffffffffffe80;
  SolverOptionManager *this_02;
  offset_in_BasicSolver_to_subr in_stack_fffffffffffffe90;
  SolverOptionManager *this_03;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  SolverOptionManager *in_stack_fffffffffffffed0;
  OptionValueInfo *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  ValueArrayRef local_e8;
  ValueArrayRef local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  size_type sStack_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  _Rb_tree_node_base _Stack_88;
  size_t sStack_68;
  code *local_60;
  undefined8 local_58;
  ValueArrayRef local_50 [2];
  uint local_24;
  undefined8 local_20;
  undefined1 local_10 [8];
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  pcVar1 = fmt::BasicCStringRef<char>::c_str((BasicCStringRef<char> *)&stack0xfffffffffffffff8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb8),pcVar1);
  pcVar1 = fmt::BasicCStringRef<char>::c_str((BasicCStringRef<char> *)local_10);
  if (pcVar1 == (char *)0x0) {
    this_03 = (SolverOptionManager *)&stack0xfffffffffffffff8;
  }
  else {
    this_03 = (SolverOptionManager *)local_10;
  }
  pcVar1 = fmt::BasicCStringRef<char>::c_str((BasicCStringRef<char> *)this_03);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd8),pcVar1);
  *(undefined8 *)(in_RDI + 0x178) = local_20;
  if ((local_24 & 4) != 0) {
    *(undefined1 *)(in_RDI + 0x244) = 1;
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x118),(string *)(in_RDI + 0xd8));
  pcVar1 = (char *)(in_RDI + 0x28);
  name_00 = (char *)operator_new(0xd8);
  InitMetaInfoAndOptions(fmt::BasicCStringRef<char>,fmt::BasicCStringRef<char>,long,int)::
  VersionOption::VersionOption(mp::BasicSolver__
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  SolverOptionManager::AddOption(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr
            (in_stack_fffffffffffffdf0);
  ValueArrayRef::ValueArrayRef(local_50);
  local_60 = GetOptionFile_abi_cxx11_;
  local_58 = 0;
  _Stack_88._M_right = (_Base_ptr)UseOptionFile;
  sStack_68 = 0;
  values_01.size_ = (int)in_stack_fffffffffffffee8;
  values_01._12_4_ = SUB84(in_stack_fffffffffffffee8,4);
  values_01.values_ = in_stack_fffffffffffffee0;
  SolverOptionManager::AddStrOption<mp::BasicSolver>
            (this_03,name_00,pcVar1,in_stack_fffffffffffffe90,
             (offset_in_BasicSolver_to_subr)in_stack_fffffffffffffe80,values_01);
  _Stack_88._M_parent = (_Base_ptr)GetWantSol;
  _Stack_88._M_left = (_Base_ptr)0x0;
  local_90 = SetWantSol;
  _Stack_88._M_color = _S_red;
  _Stack_88._4_4_ = 0;
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (Get)this_03,(offset_in_BasicSolver_to_subr)pcVar1);
  local_a0 = GetObjNo;
  local_98 = 0;
  local_b8._8_8_ = SetObjNo;
  sStack_a8 = 0;
  pcVar3 = SetObjNo;
  puVar4 = (unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *)0x0;
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (Get)this_03,(offset_in_BasicSolver_to_subr)pcVar1);
  get = operator_new(0xd8);
  InitMetaInfoAndOptions::BoolOption::BoolOption
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  this_02 = (SolverOptionManager *)local_b8;
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>(puVar4,(pointer)pcVar3);
  SolverOptionManager::AddOption(this_02,in_stack_fffffffffffffe78);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(puVar4);
  opt = (OptionPtr *)operator_new(0xd8);
  InitMetaInfoAndOptions::BoolOption::BoolOption
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>(puVar4,(pointer)pcVar3);
  SolverOptionManager::AddOption(this_02,opt);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(puVar4);
  operator_new(0xd8);
  InitMetaInfoAndOptions::BoolOption::BoolOption
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  puVar5 = local_c8;
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>(puVar4,(pointer)pcVar3);
  SolverOptionManager::AddOption(this_02,opt);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(puVar4);
  if ((local_24 & 2) != 0) {
    description = (char *)(in_RDI + 0x28);
    name_01 = (char *)(in_RDI + 0x240);
    ValueArrayRef::ValueArrayRef<3>(&local_d8,&InitMetaInfoAndOptions::values_multiobj_,0);
    values._8_8_ = puVar5;
    values.values_ = in_stack_fffffffffffffe48;
    SolverOptionManager::AddStoredOption<int>
              (in_stack_fffffffffffffe40,name_01,description,in_stack_fffffffffffffe28,values);
    this_01 = (SolverOptionManager *)(in_RDI + 0x28);
    pOVar2 = (OptionValueInfo *)(in_RDI + 0x248);
    ValueArrayRef::ValueArrayRef<2>(&local_e8,&InitMetaInfoAndOptions::values_multiobjweight_,0);
    values_00._8_8_ = puVar5;
    values_00.values_ = pOVar2;
    SolverOptionManager::AddStoredOption<int>
              (this_01,name_01,description,in_stack_fffffffffffffe28,values_00);
  }
  pcVar3 = SetTiming;
  puVar4 = (unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *)0x0;
  SolverOptionManager::AddIntOption<mp::BasicSolver,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (Get)this_03,(offset_in_BasicSolver_to_subr)pcVar1);
  if ((local_24 & 1) != 0) {
    this_00 = (BoolOption *)(in_RDI + 0x28);
    operator_new(0xd8);
    InitMetaInfoAndOptions::BoolOption::BoolOption
              (this_00,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
              );
    std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
    unique_ptr<std::default_delete<mp::SolverOption>,void>(puVar4,(pointer)pcVar3);
    SolverOptionManager::AddOption(this_02,opt);
    std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(puVar4);
    ValueArrayRef::ValueArrayRef((ValueArrayRef *)&stack0xfffffffffffffee0);
    values_02.size_ = (int)in_stack_fffffffffffffee8;
    values_02._12_4_ = SUB84(in_stack_fffffffffffffee8,4);
    values_02.values_ = in_stack_fffffffffffffee0;
    SolverOptionManager::AddStrOption<mp::BasicSolver>
              (this_03,name_00,pcVar1,(offset_in_BasicSolver_to_subr)get,
               (offset_in_BasicSolver_to_subr)this_02,values_02);
  }
  return;
}

Assistant:

void BasicSolver::InitMetaInfoAndOptions(
  fmt::CStringRef name, fmt::CStringRef long_name, long date, int flags) {
  name_ = name.c_str();
  long_name_ = (long_name.c_str() ? long_name : name).c_str();
  date_ = date;
  if (flags & MULTIPLE_OBJ_NATIVE)
    multiobj_has_native_ = true;

  version_ = long_name_;

  struct VersionOption : SolverOption {
    BasicSolver& s;
    VersionOption(BasicSolver& s) : SolverOption("tech:version version",
      "Single-word phrase: report version details "
      "before solving the problem.", ValueArrayRef(), true), s(s) {}

    void Write(fmt::Writer& w) { w << ((s.bool_options_ & SHOW_VERSION) != 0); }
    void Parse(const char*&, bool) { s.bool_options_ |= SHOW_VERSION; }
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  AddOption(OptionPtr(new VersionOption(*this)));

  AddStrOption(
    "tech:optionfile optionfile option:file",
    "Name of an AMPL solver option file to read "
    "(surrounded by 'single' or "
    "\"double\" quotes if the name contains blanks). "
    "Lines that start with # are ignored.  Otherwise, each nonempty "
    "line should contain \"name=value\", e.g., \"lim:iter=500\".",
    &Solver::GetOptionFile, &Solver::UseOptionFile);


  AddIntOption(
    "tech:wantsol wantsol",
    "In a stand-alone invocation (no ``-AMPL`` on the command line), "
    "what solution information to write.  Sum of\n"
    "\n"
    "| 1 - Write ``.sol`` file\n"
    "| 2 - Primal variables to stdout\n"
    "| 4 - Dual variables to stdout\n"
    "| 8 - Suppress solution message.",
    &Solver::GetWantSol, &Solver::SetWantSol);

  AddIntOption(
    "obj:no objno",
    "Objective to optimize:\n"
    "\n"
    "| 0 - None\n"
    "| 1 - First (default, if available)\n"
    "| 2 - Second (if available), etc.\n",
    &Solver::GetObjNo, &Solver::SetObjNo);

  struct BoolOption : TypedSolverOption<int> {
    bool& value_;
    BoolOption(bool& value, const char* name, const char* description)
      : TypedSolverOption<int>(name, description), value_(value) {}

    void GetValue(fmt::LongLong& value) const { value = value_; }
    void SetValue(fmt::LongLong value) {
      if (value != 0 && value != 1)
        throw InvalidOptionValue(name(), value);
      value_ = value != 0;
    }
  };


  AddOption(OptionPtr(
      new BoolOption(verbose_, "tech:outlev_mp outlev_mp",
                     "0*/1: whether to print MP model information.")));

  AddOption(OptionPtr(new BoolOption(
      debug_, "tech:debug debug",
      "0*/1: whether to assist testing & debugging, e.g., "
      "by outputting auxiliary information (mostly via suffixes).")));

  AddOption(OptionPtr(new BoolOption(
      report_uncertain_sol_, "sol:report_uncertain report_uncertain_sol",
      "0/1*: whether to report objective value(s) in solve_message "
      "when solve_result is '?' (unknown).")));

  static const mp::OptionValueInfo values_multiobj_[] = {
      { "0", "Single objective, see option obj:no (default)", 0},
      { "1", "Multi-objective, solver's native handling if available", 1},
      { "2", "Multi-objective, force emulation", 2}
  };
  if ((flags & MULTIPLE_OBJ) != 0) {
    AddStoredOption(
        "obj:multi multiobj",
        "Whether to use multi-objective optimization:\n"
        "\n.. value-table::\n\n"
        "When obj:multi>0 and several objectives are present, suffixes "
        ".objpriority, .objweight, .objreltol, and .objabstol on the "
        "objectives are relevant.  Objectives with greater .objpriority "
        "values (integer values) have higher priority.  Objectives with "
        "the same .objpriority are weighted by .objweight, "
        "according to the option obj:multi:weight.\n"
        "\n"
        "Objectives "
        "with positive .objabstol or .objreltol are allowed to be "
        "degraded by lower priority objectives by amounts not exceeding "
        "the .objabstol (absolute) and .objreltol (relative) limits.\n"
        "\n"
        "Note that with solver's native handling (when obj:multi=1 and supported), "
        "some solvers might have special rules for the tolerances, especially for LP, "
        "and not allow quadratic objectives. See the solver documentation.",
        multiobj_, values_multiobj_);

    static const mp::OptionValueInfo values_multiobjweight_[] = {
        { "1", "relative to the sense of the 1st objective", 1},
        { "2", "relative to its own sense (default)", 2}
    };
    AddStoredOption(
        "obj:multi:weight multiobjweight obj:multi:weights multiobjweights",
        "How to interpret each objective's weight sign:\n"
        "\n.. value-table::\n\n"
        "With the 1st option (legacy behaviour), negative .objweight "
        "for objective i would make "
        "objective i's sense the opposite of the model's 1st objective. "
        "Otherwise, it would make objective i's sense the opposite to its sense "
        "defined in the model.",
        multiobj_weight_, values_multiobjweight_);
  }

  AddIntOption("tech:timing timing tech:report_times report_times",
    "0*/1/2: Whether to print and return timings for the run, all times are wall "
    "times. If set to 1, return the solution times in the problem suffixes "
    "'time_solver', 'time_setup' and 'time', 'time'= time_solver+time_setup+time_output is a "
    "measure of the total time spent in the solver driver. If set to 2, return "
    "more granular times, including 'time_read', 'time_conversion' and 'time_output'.",
    &Solver::GetTiming, &Solver::SetTiming);

  if ((flags & MULTIPLE_SOL) != 0) {

    AddOption(OptionPtr(new BoolOption(count_solutions_, "sol:count countsolutions",
        "0*/1: Whether to count the number of solutions "
        "and return it in the ``.nsol`` problem suffix.")));

    AddStrOption(
          "sol:stub solstub solutionstub",
          "Stub for solution files.  If ``solutionstub`` is specified, "
          "found solutions are written to files (``solutionstub & '1' & "
          "'.sol'``) ... (``solutionstub & Current.nsol & '.sol'``), where "
          "``Current.nsol`` holds the number of returned solutions.  That is, "
          "file names are obtained by appending 1, 2, ... ``Current.nsol`` to "
          "``solutionstub``.",
          &Solver::GetSolutionStub, &Solver::SetSolutionStub);
  }
}